

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_alloc_restoration_buffers(AV1_COMMON *cm,_Bool is_sgr_enabled)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int32_t *piVar4;
  RestorationLineBuffers *pRVar5;
  uint8_t *puVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  uVar1 = cm->seq_params->monochrome;
  if (cm->rst_tmpbuf == (int32_t *)0x0 && is_sgr_enabled) {
    piVar4 = (int32_t *)aom_memalign(0x10,0x13b9a0);
    cm->rst_tmpbuf = piVar4;
    if (piVar4 == (int32_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rst_tmpbuf");
    }
  }
  if (cm->rlbs == (RestorationLineBuffers *)0x0) {
    pRVar5 = (RestorationLineBuffers *)aom_malloc(0x1260);
    cm->rlbs = pRVar5;
    if (pRVar5 == (RestorationLineBuffers *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rlbs");
    }
  }
  iVar3 = cm->superres_upscaled_width;
  iVar7 = (cm->mi_params).mi_rows;
  iVar11 = iVar7 * 4 + 0x47;
  iVar7 = iVar7 * 4 + 0x86;
  if (-1 < iVar11) {
    iVar7 = iVar11;
  }
  bVar2 = cm->seq_params->use_highbitdepth;
  piVar9 = &cm->rst_info[0].boundaries.stripe_boundary_size;
  uVar10 = 0;
  while( true ) {
    uVar8 = 0;
    if (uVar10 != 0) {
      uVar8 = (uint)(cm->seq_params->subsampling_x != 0);
    }
    uVar8 = ((int)(uVar8 + iVar3) >> (sbyte)uVar8) + 0x27U & 0xffffffe0;
    iVar11 = (iVar7 >> 6) * 2 * uVar8 << (bVar2 & 0x1f);
    if ((((RestorationStripeBoundaries *)(piVar9 + -5))->stripe_boundary_above == (uint8_t *)0x0 ||
         iVar11 != *piVar9) || (*(uint8_t **)(piVar9 + -3) == (uint8_t *)0x0)) {
      aom_free(((RestorationStripeBoundaries *)(piVar9 + -5))->stripe_boundary_above);
      aom_free(*(uint8_t **)(piVar9 + -3));
      puVar6 = (uint8_t *)aom_memalign(0x20,(long)iVar11);
      ((RestorationStripeBoundaries *)(piVar9 + -5))->stripe_boundary_above = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_above");
      }
      puVar6 = (uint8_t *)aom_memalign(0x20,(long)iVar11);
      *(uint8_t **)(piVar9 + -3) = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_below");
      }
      *piVar9 = iVar11;
    }
    piVar9[-1] = uVar8;
    if (uVar1 != '\0') break;
    piVar9 = piVar9 + 0x10;
    bVar12 = 1 < uVar10;
    uVar10 = uVar10 + 1;
    if (bVar12) {
      return;
    }
  }
  return;
}

Assistant:

void av1_alloc_restoration_buffers(AV1_COMMON *cm, bool is_sgr_enabled) {
  const int num_planes = av1_num_planes(cm);

  if (cm->rst_tmpbuf == NULL && is_sgr_enabled) {
    CHECK_MEM_ERROR(cm, cm->rst_tmpbuf,
                    (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
  }

  if (cm->rlbs == NULL) {
    CHECK_MEM_ERROR(cm, cm->rlbs, aom_malloc(sizeof(RestorationLineBuffers)));
  }

  // For striped loop restoration, we divide each plane into "stripes",
  // of height 64 luma pixels but with an offset by RESTORATION_UNIT_OFFSET
  // luma pixels to match the output from CDEF. We will need to store 2 *
  // RESTORATION_CTX_VERT lines of data for each stripe.
  int mi_h = cm->mi_params.mi_rows;
  const int ext_h = RESTORATION_UNIT_OFFSET + (mi_h << MI_SIZE_LOG2);
  const int num_stripes = (ext_h + 63) / 64;

  // Now we need to allocate enough space to store the line buffers for the
  // stripes
  const int frame_w = cm->superres_upscaled_width;
  const int use_highbd = cm->seq_params->use_highbitdepth;

  for (int p = 0; p < num_planes; ++p) {
    const int is_uv = p > 0;
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    const int plane_w = ((frame_w + ss_x) >> ss_x) + 2 * RESTORATION_EXTRA_HORZ;
    const int stride = ALIGN_POWER_OF_TWO(plane_w, 5);
    const int buf_size = num_stripes * stride * RESTORATION_CTX_VERT
                         << use_highbd;
    RestorationStripeBoundaries *boundaries = &cm->rst_info[p].boundaries;

    if (buf_size != boundaries->stripe_boundary_size ||
        boundaries->stripe_boundary_above == NULL ||
        boundaries->stripe_boundary_below == NULL) {
      aom_free(boundaries->stripe_boundary_above);
      aom_free(boundaries->stripe_boundary_below);

      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_above,
                      (uint8_t *)aom_memalign(32, buf_size));
      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_below,
                      (uint8_t *)aom_memalign(32, buf_size));

      boundaries->stripe_boundary_size = buf_size;
    }
    boundaries->stripe_boundary_stride = stride;
  }
}